

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallelepiped.cpp
# Opt level: O2

Intersection * __thiscall Parallelepiped::intersects(Parallelepiped *this,Ray *r)

{
  reference ppTVar1;
  Intersection *pIVar2;
  Intersection *pIVar3;
  int t;
  size_type __n;
  
  pIVar3 = (Intersection *)0x0;
  for (__n = 0; __n != 0xc; __n = __n + 1) {
    ppTVar1 = std::vector<Triangle_*,_std::allocator<Triangle_*>_>::at(&this->triangles,__n);
    pIVar2 = Triangle::intersects(*ppTVar1,r);
    if (pIVar2 != (Intersection *)0x0) {
      pIVar3 = pIVar2;
    }
  }
  return pIVar3;
}

Assistant:

Intersection *Parallelepiped::intersects(Ray &r) {
    Intersection *i = NULL, *tmp;
    
    for(int t = 0; t < N_TRIANGLES; ++t) {
        if( tmp = triangles.at(t)->intersects(r) ) {
            i = tmp;
        }
    }
    return i;
}